

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_product_impl<2,true,Eigen::Matrix<float,-1,-1,1,-1,-1>,false,Eigen::Matrix<float,-1,-1,0,-1,1>,false>
     ::run<Eigen::Matrix<float,_1,_1,0,_1,1>>
               (Matrix<float,__1,__1,_0,__1,_1> *dst,Matrix<float,__1,__1,_1,__1,__1> *a_lhs,
               Matrix<float,__1,__1,_0,__1,_1> *a_rhs,Scalar *alpha)

{
  Index _depth;
  long _rows;
  long *plVar1;
  Index cols;
  Scalar *_lhs;
  Index lhsStride;
  Scalar *_rhs;
  Index rhsStride;
  Scalar *_res;
  Index resIncr;
  Index resStride;
  undefined1 local_c0 [8];
  BlockingType blocking;
  Index stripedDepth;
  Index stripedCols;
  Index local_70;
  long local_68;
  Index stripedRows;
  Scalar local_58;
  Scalar actualAlpha;
  RhsScalar rhs_alpha;
  LhsScalar lhs_alpha;
  type rhs;
  type lhs;
  Scalar *alpha_local;
  Matrix<float,__1,__1,_0,__1,_1> *a_rhs_local;
  Matrix<float,__1,__1,_1,__1,__1> *a_lhs_local;
  Matrix<float,__1,__1,_0,__1,_1> *dst_local;
  
  lhs = (type)alpha;
  alpha_local = (Scalar *)a_rhs;
  a_rhs_local = (Matrix<float,__1,__1,_0,__1,_1> *)a_lhs;
  a_lhs_local = (Matrix<float,__1,__1,_1,__1,__1> *)dst;
  rhs = (type)blas_traits<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::extract(a_lhs);
  _rhs_alpha = &blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::extract
                          ((Matrix<float,__1,__1,_0,__1,_1> *)alpha_local)->
                super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_>;
  actualAlpha = blas_traits<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::extractScalarFactor
                          ((Matrix<float,__1,__1,_1,__1,__1> *)a_rhs_local);
  local_58 = blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::extractScalarFactor
                       ((Matrix<float,__1,__1,_0,__1,_1> *)alpha_local);
  stripedRows._4_4_ =
       *(float *)&(lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.
                  m_data * actualAlpha * local_58;
  local_70 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)rhs);
  stripedCols = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)rhs);
  plVar1 = std::min<long>(&local_70,&stripedCols);
  local_68 = *plVar1;
  cols = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::cols(_rhs_alpha);
  blocking.m_sizeB =
       PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::cols
                 ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)rhs);
  gemm_blocking_space<0,_float,_float,_-1,_1,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,_1,__1,_4,_false> *)local_c0,local_68,cols,
             blocking.m_sizeB,1,false);
  _rows = local_68;
  _depth = blocking.m_sizeB;
  _lhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>::coeffRef
                   ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)rhs,0,0);
  lhsStride = Matrix<float,_-1,_-1,_1,_-1,_-1>::outerStride((Matrix<float,__1,__1,_1,__1,__1> *)rhs)
  ;
  _rhs = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::coeffRef(_rhs_alpha,0,0);
  rhsStride = Matrix<float,_-1,_-1,_0,_-1,_1>::outerStride
                        ((Matrix<float,__1,__1,_0,__1,_1> *)_rhs_alpha);
  _res = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::coeffRef
                   ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_> *)a_lhs_local,0,0);
  resIncr = Matrix<float,_-1,_-1,_0,_-1,_1>::innerStride
                      ((Matrix<float,__1,__1,_0,__1,_1> *)a_lhs_local);
  resStride = Matrix<float,_-1,_-1,_0,_-1,_1>::outerStride
                        ((Matrix<float,__1,__1,_0,__1,_1> *)a_lhs_local);
  product_triangular_matrix_matrix<float,_long,_2,_true,_1,_false,_0,_false,_0,_1,_0>::run
            (_rows,cols,_depth,_lhs,lhsStride,_rhs,rhsStride,_res,resIncr,resStride,
             (float *)((long)&stripedRows + 4),(level3_blocking<float,_float> *)local_c0);
  gemm_blocking_space<0,_float,_float,_-1,_1,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,__1,_1,__1,_4,_false> *)local_c0);
  return;
}

Assistant:

static void run(Dest& dst, const Lhs &a_lhs, const Rhs &a_rhs, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar  LhsScalar;
    typedef typename Rhs::Scalar  RhsScalar;
    typedef typename Dest::Scalar Scalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef typename internal::remove_all<ActualLhsType>::type ActualLhsTypeCleaned;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;
    
    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    LhsScalar lhs_alpha = LhsBlasTraits::extractScalarFactor(a_lhs);
    RhsScalar rhs_alpha = RhsBlasTraits::extractScalarFactor(a_rhs);
    Scalar actualAlpha = alpha * lhs_alpha * rhs_alpha;

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Lhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxColsAtCompileTime,4> BlockingType;

    enum { IsLower = (Mode&Lower) == Lower };
    Index stripedRows  = ((!LhsIsTriangular) || (IsLower))  ? lhs.rows() : (std::min)(lhs.rows(),lhs.cols());
    Index stripedCols  = ((LhsIsTriangular)  || (!IsLower)) ? rhs.cols() : (std::min)(rhs.cols(),rhs.rows());
    Index stripedDepth = LhsIsTriangular ? ((!IsLower) ? lhs.cols() : (std::min)(lhs.cols(),lhs.rows()))
                                         : ((IsLower)  ? rhs.rows() : (std::min)(rhs.rows(),rhs.cols()));

    BlockingType blocking(stripedRows, stripedCols, stripedDepth, 1, false);

    internal::product_triangular_matrix_matrix<Scalar, Index,
      Mode, LhsIsTriangular,
      (internal::traits<ActualLhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, LhsBlasTraits::NeedToConjugate,
      (internal::traits<ActualRhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, RhsBlasTraits::NeedToConjugate,
      (internal::traits<Dest          >::Flags&RowMajorBit) ? RowMajor : ColMajor, Dest::InnerStrideAtCompileTime>
      ::run(
        stripedRows, stripedCols, stripedDepth,   // sizes
        &lhs.coeffRef(0,0), lhs.outerStride(),    // lhs info
        &rhs.coeffRef(0,0), rhs.outerStride(),    // rhs info
        &dst.coeffRef(0,0), dst.innerStride(), dst.outerStride(),    // result info
        actualAlpha, blocking
      );

    // Apply correction if the diagonal is unit and a scalar factor was nested:
    if ((Mode&UnitDiag)==UnitDiag)
    {
      if (LhsIsTriangular && lhs_alpha!=LhsScalar(1))
      {
        Index diagSize = (std::min)(lhs.rows(),lhs.cols());
        dst.topRows(diagSize) -= ((lhs_alpha-LhsScalar(1))*a_rhs).topRows(diagSize);
      }
      else if ((!LhsIsTriangular) && rhs_alpha!=RhsScalar(1))
      {
        Index diagSize = (std::min)(rhs.rows(),rhs.cols());
        dst.leftCols(diagSize) -= (rhs_alpha-RhsScalar(1))*a_lhs.leftCols(diagSize);
      }
    }
  }